

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O1

size_t __thiscall CoreML::Specification::ImageFeatureType::ByteSizeLong(ImageFeatureType *this)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  
  if (this->width_ == 0) {
    sVar6 = 0;
  }
  else {
    uVar4 = this->width_ | 1;
    lVar2 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    sVar6 = (ulong)((int)lVar2 * 9 + 0x49U >> 6) + 1;
  }
  if (this->height_ != 0) {
    uVar4 = this->height_ | 1;
    lVar2 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    sVar6 = sVar6 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
  }
  uVar3 = this->colorspace_;
  if (uVar3 != 0) {
    if ((int)uVar3 < 0) {
      uVar4 = 0xb;
    }
    else {
      iVar1 = 0x1f;
      if ((uVar3 | 1) != 0) {
        for (; (uVar3 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      uVar4 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
    }
    sVar6 = sVar6 + uVar4;
  }
  if (this->_oneof_case_[0] == 0x1f) {
    sVar5 = ImageFeatureType_ImageSizeRange::ByteSizeLong((this->SizeFlexibility_).imagesizerange_);
  }
  else {
    if (this->_oneof_case_[0] != 0x15) goto LAB_00457514;
    sVar5 = ImageFeatureType_EnumeratedImageSizes::ByteSizeLong
                      ((this->SizeFlexibility_).enumeratedsizes_);
  }
  uVar3 = (uint)sVar5 | 1;
  iVar1 = 0x1f;
  if (uVar3 != 0) {
    for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
    }
  }
  sVar6 = sVar6 + sVar5 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
LAB_00457514:
  this->_cached_size_ = (int)sVar6;
  return sVar6;
}

Assistant:

size_t ImageFeatureType::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ImageFeatureType)
  size_t total_size = 0;

  // int64 width = 1;
  if (this->width() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int64Size(
        this->width());
  }

  // int64 height = 2;
  if (this->height() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int64Size(
        this->height());
  }

  // .CoreML.Specification.ImageFeatureType.ColorSpace colorSpace = 3;
  if (this->colorspace() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->colorspace());
  }

  switch (SizeFlexibility_case()) {
    // .CoreML.Specification.ImageFeatureType.EnumeratedImageSizes enumeratedSizes = 21;
    case kEnumeratedSizes: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *SizeFlexibility_.enumeratedsizes_);
      break;
    }
    // .CoreML.Specification.ImageFeatureType.ImageSizeRange imageSizeRange = 31;
    case kImageSizeRange: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *SizeFlexibility_.imagesizerange_);
      break;
    }
    case SIZEFLEXIBILITY_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}